

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_representation_half.cpp
# Opt level: O2

int MyTest_TestFormula_Test::AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<MyTest> *this_01;
  TestMetaFactoryBase<std::tuple<unsigned_long,_unsigned_long>_> *meta_factory;
  allocator<char> local_c3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  char local_b0 [8];
  undefined8 uStack_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  char local_90 [8];
  undefined8 uStack_88;
  CodeLocation local_80;
  CodeLocation local_58;
  string local_30;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"MyTest",&local_c1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/oprecomp[P]flexfloat/test/value_representation_half.cpp"
             ,&local_c2);
  local_58.file._M_string_length = local_98;
  local_58.file._M_dataplus._M_p = (pointer)&local_58.file.field_2;
  if (local_a0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90) {
    local_58.file.field_2._8_8_ = uStack_88;
  }
  else {
    local_58.file._M_dataplus._M_p = (pointer)local_a0;
  }
  local_98 = 0;
  local_90[0] = '\0';
  local_58.line = 0x2d;
  local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_90;
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::GetTestSuitePatternHolder<MyTest>
                      (this_00,&local_30,&local_58);
  meta_factory = (TestMetaFactoryBase<std::tuple<unsigned_long,_unsigned_long>_> *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)0x0;
  testing::internal::TestMetaFactory<MyTest_TestFormula_Test>::TestMetaFactory
            ((TestMetaFactory<MyTest_TestFormula_Test> *)meta_factory);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/oprecomp[P]flexfloat/test/value_representation_half.cpp"
             ,&local_c3);
  local_80.file._M_string_length = local_b8;
  local_80.file._M_dataplus._M_p = (pointer)&local_80.file.field_2;
  if (local_c0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0) {
    local_80.file.field_2._8_8_ = uStack_a8;
  }
  else {
    local_80.file._M_dataplus._M_p = (pointer)local_c0;
  }
  local_b8 = 0;
  local_b0[0] = '\0';
  local_80.line = 0x2d;
  local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_b0;
  testing::internal::ParameterizedTestSuiteInfo<MyTest>::AddTestPattern
            (this_01,"MyTest","TestFormula",meta_factory,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_30);
  return 0;
}

Assistant:

TEST_P(MyTest, TestFormula)
{
    uint64_t const in_number = std::get<0>(GetParam());
    uint64_t const out_number = std::get<1>(GetParam());

    fp_t d = reinterpret_double_bits_as(in_number);
    fp_t expected = reinterpret_double_bits_as(out_number);

    // IEEE half.
    flexfloat<5, 10> fx = d;
    fp_t recoverd_fx = (fp_t)(fx);

     printf("number:     \t"); show(d);
     printf("recoverd_fx:\t"); show(recoverd_fx);
     printf("expected:   \t"); show(expected);

    // Enforces the same reprsentation for nan's.
    uint_t out = reinterpret_as_double_bits(recoverd_fx);

    #ifndef FLEXFLOAT_ON_SINGLE
    #ifdef FLEXFLOAT_ROUNDING
    ASSERT_EQ(out, out_number);
    #endif
    #endif
    // ASSERT_EQ(recoverd_fx, expected); // does not work for NAN's.
}